

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p_00;
  long lVar1;
  WhereLoop *p;
  WhereLevel *pLevel;
  int i;
  WhereInfo *pWInfo_local;
  sqlite3 *db_local;
  
  if (pWInfo != (WhereInfo *)0x0) {
    for (pLevel._4_4_ = 0; pLevel._4_4_ < (int)(uint)pWInfo->nLevel; pLevel._4_4_ = pLevel._4_4_ + 1
        ) {
      lVar1 = (long)pLevel._4_4_;
      if ((pWInfo->a[lVar1].pWLoop != (WhereLoop *)0x0) &&
         (((pWInfo->a[lVar1].pWLoop)->wsFlags & 0x800) != 0)) {
        sqlite3DbFree(db,pWInfo->a[lVar1].u.in.aInLoop);
      }
    }
    sqlite3WhereClauseClear(&pWInfo->sWC);
    while (pWInfo->pLoops != (WhereLoop *)0x0) {
      p_00 = pWInfo->pLoops;
      pWInfo->pLoops = p_00->pNextLoop;
      whereLoopDelete(db,p_00);
    }
    sqlite3DbFreeNN(db,pWInfo);
  }
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  if( ALWAYS(pWInfo) ){
    int i;
    for(i=0; i<pWInfo->nLevel; i++){
      WhereLevel *pLevel = &pWInfo->a[i];
      if( pLevel->pWLoop && (pLevel->pWLoop->wsFlags & WHERE_IN_ABLE) ){
        sqlite3DbFree(db, pLevel->u.in.aInLoop);
      }
    }
    sqlite3WhereClauseClear(&pWInfo->sWC);
    while( pWInfo->pLoops ){
      WhereLoop *p = pWInfo->pLoops;
      pWInfo->pLoops = p->pNextLoop;
      whereLoopDelete(db, p);
    }
    sqlite3DbFreeNN(db, pWInfo);
  }
}